

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

size_t ReadDataFromDisk(FILE *file,char *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  allocator local_5e;
  allocator local_5d;
  Logger local_5c;
  string local_58;
  string local_38;
  
  if (file == (FILE *)0x0) {
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_58,"ReadDataFromDisk",&local_5e);
    poVar3 = Logger::Start(ERR,&local_38,0xd0,&local_58);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"file");
    std::operator<<(poVar3," == NULL \n");
  }
  else {
    if (buf != (char *)0x0) {
      iVar1 = feof((FILE *)file);
      if (iVar1 == 0) {
        sVar2 = fread(buf,1,len,(FILE *)file);
        if (len < sVar2) {
          local_5c.severity_ = FATAL;
          std::__cxx11::string::string
                    ((string *)&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                     ,&local_5d);
          std::__cxx11::string::string((string *)&local_58,"ReadDataFromDisk",&local_5e);
          poVar3 = Logger::Start(FATAL,&local_38,0xd9,&local_58);
          std::operator<<(poVar3,"Error: invoke fread().");
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_38);
          Logger::~Logger(&local_5c);
        }
      }
      else {
        sVar2 = 0;
      }
      return sVar2;
    }
    local_5c.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
               ,&local_5d);
    std::__cxx11::string::string((string *)&local_58,"ReadDataFromDisk",&local_5e);
    poVar3 = Logger::Start(ERR,&local_38,0xd1,&local_58);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/file_util.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"buf");
    std::operator<<(poVar3," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  Logger::~Logger(&local_5c);
  abort();
}

Assistant:

inline size_t ReadDataFromDisk(FILE *file, char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GE(len, 0);
  // Reach the end of the file
  if (feof(file)) {
    return 0;
  }
  size_t ret = fread(buf, 1, len, file);
  if (ret > len) {
    LOG(FATAL) << "Error: invoke fread().";
  }
  return ret;
}